

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O2

void __thiscall settings_tests::Merge::test_method(Merge *this)

{
  char cVar1;
  int iVar2;
  Action AVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  FILE *__s;
  system_error *psVar10;
  int *piVar11;
  error_category *peVar12;
  mapped_type *this_00;
  mapped_type *pmVar13;
  mapped_type *this_01;
  size_t sVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  pointer pcVar18;
  iterator in_R8;
  iterator in_R9;
  long lVar19;
  long in_FS_OFFSET;
  bool bVar20;
  const_string msg;
  const_string msg_00;
  const_string file;
  Span<unsigned_char> output;
  Span<const_unsigned_char> s;
  const_string file_00;
  error_code __ec;
  check_type cVar21;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  allocator<char> local_27a;
  allocator<char> local_279;
  anon_class_24_3_f552ebe0 push_values;
  int value_suffix;
  undefined2 local_25c;
  char local_25a [2];
  string local_258;
  CHash256 out_sha;
  Action local_1d0 [4];
  Action local_1c0 [4];
  undefined1 local_1b0 [32];
  string out_sha_hex;
  key_type local_138;
  uchar out_sha_bytes [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  local_e8;
  _Rb_tree_node_base local_b0;
  size_t local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  local_88;
  string desc;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&out_sha.sha);
  pcVar9 = getenv("SETTINGS_MERGE_TEST_OUT");
  if (pcVar9 == (char *)0x0) {
    __s = (FILE *)0x0;
  }
  else {
    fs::path::path((path *)out_sha_bytes,pcVar9);
    __s = fsbridge::fopen((char *)out_sha_bytes,"w");
    std::filesystem::__cxx11::path::~path((path *)out_sha_bytes);
    if (__s == (FILE *)0x0) {
      psVar10 = (system_error *)__cxa_allocate_exception(0x20);
      piVar11 = __errno_location();
      iVar8 = *piVar11;
      peVar12 = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(psVar10,iVar8,peVar12,"fopen failed");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        __cxa_throw(psVar10,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      goto LAB_005037a2;
    }
  }
  ChainTypeToString_abi_cxx11_(&local_258,MAIN);
  local_1d0[2] = END;
  local_1d0[0] = END;
  local_1d0[1] = END;
  bVar7 = false;
  lVar17 = 0;
  iVar8 = -1;
LAB_00502d13:
  do {
    if (lVar17 != 0xc) {
      iVar2 = *(int *)((long)local_1d0 + lVar17);
      if (iVar2 == iVar8) {
        bVar7 = true;
      }
      bVar20 = 0xfffffffd < iVar2 - 3U;
      in_R8 = (iterator)CONCAT71((int7)((ulong)in_R8 >> 8),bVar20);
      lVar17 = lVar17 + 4;
      iVar8 = iVar2;
      if ((bool)(bVar20 & (bVar7 ^ 1U))) goto LAB_00502d13;
    }
    if (!bVar7) {
      local_1c0[2] = END;
      local_1c0[0] = END;
      local_1c0[1] = END;
      bVar7 = false;
      lVar17 = 0;
      iVar8 = -1;
LAB_00502d89:
      do {
        if (lVar17 != 0xc) {
          iVar2 = *(int *)((long)local_1c0 + lVar17);
          if (iVar2 == iVar8) {
            bVar7 = true;
          }
          bVar20 = 0xfffffffb < iVar2 - 5U;
          in_R8 = (iterator)CONCAT71((int7)((ulong)in_R8 >> 8),bVar20);
          lVar17 = lVar17 + 4;
          iVar8 = iVar2;
          if ((bool)(bVar20 & (bVar7 ^ 1U))) goto LAB_00502d89;
        }
        if (!bVar7) {
          local_25a[0] = '\0';
          local_25a[1] = '\x01';
          for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
            cVar1 = local_25a[lVar17];
            local_25c = 0x100;
            for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              desc._M_string_length = 0;
              value_suffix = 0;
              out_sha_bytes[8] = '\0';
              out_sha_bytes[9] = '\0';
              out_sha_bytes[10] = '\0';
              out_sha_bytes[0xb] = '\0';
              out_sha_bytes[0x10] = '\0';
              out_sha_bytes[0x11] = '\0';
              out_sha_bytes[0x12] = '\0';
              out_sha_bytes[0x13] = '\0';
              out_sha_bytes[0x14] = '\0';
              out_sha_bytes[0x15] = '\0';
              out_sha_bytes[0x16] = '\0';
              out_sha_bytes[0x17] = '\0';
              out_sha_bytes._24_8_ = out_sha_bytes + 8;
              local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_e8._M_t._M_impl.super__Rb_tree_header._M_header;
              local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              local_e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              bVar7 = *(bool *)((long)&local_25c + lVar16);
              local_b0._M_color = _S_red;
              local_b0._M_parent = (_Base_ptr)0x0;
              local_b0._M_left = &local_b0;
              local_90 = 0;
              desc.field_2._M_allocated_capacity =
                   desc.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_88._M_t._M_impl.super__Rb_tree_header._M_header;
              local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              pcVar9 = "server";
              if (bVar7 != false) {
                pcVar9 = "wallet";
              }
              local_b0._M_right = local_b0._M_left;
              local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_138,pcVar9,(allocator<char> *)&out_sha_hex);
              push_values.value_suffix = &value_suffix;
              push_values.desc = &desc;
              push_values.name = &local_138;
              if (cVar1 != '\0') {
                UniValue::UniValue<const_char_(&)[7],_char[7],_true>
                          ((UniValue *)&out_sha_hex,(char (*) [7])0xc06d05);
                this_00 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                        *)out_sha_bytes,&local_138);
                UniValue::operator=(this_00,(UniValue *)&out_sha_hex);
                UniValue::~UniValue((UniValue *)&out_sha_hex);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b0," ",&local_138);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &out_sha_hex,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b0,"=forced");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &out_sha_hex);
                std::__cxx11::string::~string((string *)&out_sha_hex);
                std::__cxx11::string::~string((string *)local_1b0);
              }
              for (lVar19 = 0; lVar19 != 0xc; lVar19 = lVar19 + 4) {
                AVar3 = *(Action *)((long)local_1d0 + lVar19);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&out_sha_hex,"-",(allocator<char> *)local_1b0);
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          ::operator[](&local_e8,&local_138);
                test_method::anon_class_24_3_9e0baaf7::operator()::anon_class_24_3_f552ebe0::
                operator()(&push_values,AVar3,"a",&out_sha_hex,pmVar13);
                std::__cxx11::string::~string((string *)&out_sha_hex);
              }
              for (lVar19 = 0; lVar19 != 0xc; lVar19 = lVar19 + 4) {
                AVar3 = *(Action *)((long)local_1c0 + lVar19);
                if (AVar3 + ~SECTION_NEGATE < 0xfffffffe) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&out_sha_hex,"",&local_279);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_1b0,"",&local_27a);
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&out_sha_hex,&local_258,".");
                  std::__cxx11::string::string((string *)local_1b0,&local_258);
                }
                this_01 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                          ::operator[](&local_88,(key_type *)local_1b0);
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          ::operator[](this_01,&local_138);
                test_method::anon_class_24_3_9e0baaf7::operator()::anon_class_24_3_f552ebe0::
                operator()(&push_values,AVar3,"c",&out_sha_hex,pmVar13);
                std::__cxx11::string::~string((string *)local_1b0);
                std::__cxx11::string::~string((string *)&out_sha_hex);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&desc," || ");
              in_R9 = (iterator)0x0;
              common::GetSetting((UniValue *)&out_sha_hex,(Settings *)out_sha_bytes,&local_258,
                                 &local_138,bVar7,false,false);
              UniValue::write_abi_cxx11_
                        ((UniValue *)local_1b0,(int)(UniValue *)&out_sha_hex,(void *)0x0,0);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b0);
              std::__cxx11::string::~string((string *)local_1b0);
              UniValue::~UniValue((UniValue *)&out_sha_hex);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&desc," |");
              in_R8 = (iterator)(ulong)bVar7;
              common::GetSettingsList
                        ((vector<UniValue,_std::allocator<UniValue>_> *)local_1b0,
                         (Settings *)out_sha_bytes,&local_258,&local_138,bVar7);
              uVar6 = local_1b0._8_8_;
              for (pcVar18 = (pointer)CONCAT71(local_1b0._1_7_,local_1b0[0]);
                  pcVar18 != (pointer)uVar6; pcVar18 = pcVar18 + 0x58) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&desc," ");
                UniValue::write_abi_cxx11_((UniValue *)&out_sha_hex,(int)pcVar18,(void *)0x0,0);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &out_sha_hex);
                std::__cxx11::string::~string((string *)&out_sha_hex);
              }
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                        ((vector<UniValue,_std::allocator<UniValue>_> *)local_1b0);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&desc," |");
              bVar7 = common::OnlyHasDefaultSectionSetting
                                ((Settings *)out_sha_bytes,&local_258,&local_138);
              if (bVar7) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&desc," ignored");
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&desc,"\n");
              CSHA256::Write(&out_sha.sha,(uchar *)desc._M_dataplus._M_p,desc._M_string_length);
              if (__s != (FILE *)0x0) {
                local_290 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
                ;
                local_288 = "";
                local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_298 = &boost::unit_test::basic_cstring<char_const>::null;
                msg.m_end = in_R9;
                msg.m_begin = in_R8;
                file.m_end = (iterator)0xf4;
                file.m_begin = (iterator)&local_290;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                           (size_t)&local_2a0,msg);
                sVar14 = fwrite(desc._M_dataplus._M_p,1,desc._M_string_length,__s);
                local_1b0[0] = sVar14 == desc._M_string_length;
                local_1b0._8_8_ = (pointer)0x0;
                local_1b0._16_8_ = 0;
                local_2b0 = "fwrite(desc.data(), 1, desc.size(), out_file) == desc.size()";
                local_2a8 = "";
                out_sha_hex._M_string_length._0_1_ = 0;
                out_sha_hex._M_dataplus._M_p = "<W\x1b";
                out_sha_hex.field_2._M_allocated_capacity =
                     (size_type)boost::unit_test::lazy_ostream::inst;
                out_sha_hex.field_2._8_8_ = &local_2b0;
                local_2c0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
                ;
                local_2b8 = "";
                in_R8 = (iterator)0x2;
                in_R9 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_1b0,(lazy_ostream *)&out_sha_hex,2,0,WARN,
                           _cVar21,(size_t)&local_2c0,0xf4);
                boost::detail::shared_count::~shared_count((shared_count *)(local_1b0 + 0x10));
              }
              std::__cxx11::string::~string((string *)&local_138);
              common::Settings::~Settings((Settings *)out_sha_bytes);
              std::__cxx11::string::~string((string *)&desc);
            }
          }
        }
        bVar20 = NextString<settings_tests::MergeTestingSetup::Action,3ul>
                           ((Action (*) [3])local_1c0,SET,SECTION_NEGATE);
        bVar7 = false;
        iVar8 = -1;
        lVar17 = 0;
      } while (bVar20);
    }
    bVar20 = NextString<settings_tests::MergeTestingSetup::Action,3ul>
                       ((Action (*) [3])local_1d0,SET,NEGATE);
    bVar7 = false;
    iVar8 = -1;
    lVar17 = 0;
  } while (bVar20);
  if ((__s == (FILE *)0x0) || (iVar8 = fclose(__s), iVar8 == 0)) {
    output.m_size = 0x20;
    output.m_data = out_sha_bytes;
    CHash256::Finalize(&out_sha,output);
    s.m_size = 0x20;
    s.m_data = out_sha_bytes;
    HexStr_abi_cxx11_(&out_sha_hex,s);
    local_2d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
    ;
    local_2c8 = "";
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    file_00.m_end = (iterator)0x10a;
    file_00.m_begin = (iterator)&local_2d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2e0,
               msg_00);
    desc._M_string_length = desc._M_string_length & 0xffffffffffffff00;
    desc._M_dataplus._M_p = "<W\x1b";
    desc.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    desc.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_2f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
    ;
    local_2e8 = "";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (&desc,&local_2f0,0x10a,1,2,&out_sha_hex,"out_sha_hex",
               "79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a",
               "\"79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a\"");
    std::__cxx11::string::~string((string *)&out_sha_hex);
    std::__cxx11::string::~string((string *)&local_258);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
      return;
    }
  }
  else {
    psVar10 = (system_error *)__cxa_allocate_exception(0x20);
    puVar15 = (uint *)__errno_location();
    uVar4 = *puVar15;
    peVar12 = (error_category *)std::_V2::generic_category();
    __ec._4_4_ = 0;
    __ec._M_value = uVar4;
    __ec._M_cat = peVar12;
    std::system_error::system_error(psVar10,__ec,"fclose failed");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
      __cxa_throw(psVar10,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
LAB_005037a2:
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(Merge, MergeTestingSetup)
{
    CHash256 out_sha;
    FILE* out_file = nullptr;
    if (const char* out_path = getenv("SETTINGS_MERGE_TEST_OUT")) {
        out_file = fsbridge::fopen(out_path, "w");
        if (!out_file) throw std::system_error(errno, std::generic_category(), "fopen failed");
    }

    const std::string& network = ChainTypeToString(ChainType::MAIN);
    ForEachMergeSetup([&](const ActionList& arg_actions, const ActionList& conf_actions, bool force_set,
                          bool ignore_default_section_config) {
        std::string desc;
        int value_suffix = 0;
        common::Settings settings;

        const std::string& name = ignore_default_section_config ? "wallet" : "server";
        auto push_values = [&](Action action, const char* value_prefix, const std::string& name_prefix,
                               std::vector<common::SettingsValue>& dest) {
            if (action == SET || action == SECTION_SET) {
                for (int i = 0; i < 2; ++i) {
                    dest.emplace_back(value_prefix + ToString(++value_suffix));
                    desc += " " + name_prefix + name + "=" + dest.back().get_str();
                }
            } else if (action == NEGATE || action == SECTION_NEGATE) {
                dest.emplace_back(false);
                desc += " " + name_prefix + "no" + name;
            }
        };

        if (force_set) {
            settings.forced_settings[name] = "forced";
            desc += " " + name + "=forced";
        }
        for (Action arg_action : arg_actions) {
            push_values(arg_action, "a", "-", settings.command_line_options[name]);
        }
        for (Action conf_action : conf_actions) {
            bool use_section = conf_action == SECTION_SET || conf_action == SECTION_NEGATE;
            push_values(conf_action, "c", use_section ? network + "." : "",
                settings.ro_config[use_section ? network : ""][name]);
        }

        desc += " || ";
        desc += GetSetting(settings, network, name, ignore_default_section_config, /*ignore_nonpersistent=*/false, /*get_chain_type=*/false).write();
        desc += " |";
        for (const auto& s : GetSettingsList(settings, network, name, ignore_default_section_config)) {
            desc += " ";
            desc += s.write();
        }
        desc += " |";
        if (OnlyHasDefaultSectionSetting(settings, network, name)) desc += " ignored";
        desc += "\n";

        out_sha.Write(MakeUCharSpan(desc));
        if (out_file) {
            BOOST_REQUIRE(fwrite(desc.data(), 1, desc.size(), out_file) == desc.size());
        }
    });

    if (out_file) {
        if (fclose(out_file)) throw std::system_error(errno, std::generic_category(), "fclose failed");
        out_file = nullptr;
    }

    unsigned char out_sha_bytes[CSHA256::OUTPUT_SIZE];
    out_sha.Finalize(out_sha_bytes);
    std::string out_sha_hex = HexStr(out_sha_bytes);

    // If check below fails, should manually dump the results with:
    //
    //   SETTINGS_MERGE_TEST_OUT=results.txt ./test_bitcoin --run_test=settings_tests/Merge
    //
    // And verify diff against previous results to make sure the changes are expected.
    //
    // Results file is formatted like:
    //
    //   <input> || GetSetting() | GetSettingsList() | OnlyHasDefaultSectionSetting()
    BOOST_CHECK_EQUAL(out_sha_hex, "79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a");
}